

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O2

MESH_STYLE ON_MeshParameters::MeshStyleFromUnsigned(uint mesh_style_as_unsigned)

{
  MESH_STYLE MVar1;
  
  if ((mesh_style_as_unsigned < 0xb) && ((0x607U >> (mesh_style_as_unsigned & 0x1f) & 1) != 0)) {
    MVar1 = (&DAT_006bb71c)[mesh_style_as_unsigned];
  }
  else {
    MVar1 = unset_mesh_style;
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_mesh.cpp"
               ,0x1a58,"","Invalid mesh_style_as_unsigned parameter");
  }
  return MVar1;
}

Assistant:

ON_MeshParameters::MESH_STYLE ON_MeshParameters::MeshStyleFromUnsigned(
  unsigned int mesh_style_as_unsigned
)
{
  switch (mesh_style_as_unsigned)
  {
  ON_ENUM_FROM_UNSIGNED_CASE(ON_MeshParameters::MESH_STYLE::unset_mesh_style);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_MeshParameters::MESH_STYLE::render_mesh_fast);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_MeshParameters::MESH_STYLE::render_mesh_quality);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_MeshParameters::MESH_STYLE::render_mesh_custom);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_MeshParameters::MESH_STYLE::render_mesh_per_object);
  }

  ON_ERROR("Invalid mesh_style_as_unsigned parameter");
  return ON_MeshParameters::MESH_STYLE::unset_mesh_style;
}